

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<slang::ast::DriverVisitor&>
          (ReplicatedAssignmentPatternExpression *this,DriverVisitor *visitor)

{
  Expression *in_RSI;
  DriverVisitor *in_RDI;
  DriverVisitor *in_stack_00000018;
  AssignmentPatternExpressionBase *in_stack_00000020;
  
  count((ReplicatedAssignmentPatternExpression *)in_RDI);
  Expression::visit<slang::ast::DriverVisitor&>(in_RSI,in_RDI);
  AssignmentPatternExpressionBase::visitExprs<slang::ast::DriverVisitor&>
            (in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }